

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_>::begin
          (Data<QHashPrivate::Node<QWidget_*,_QGesture_*>_> *this)

{
  long in_FS_OFFSET;
  iterator iVar1;
  iterator<QHashPrivate::Node<QWidget_*,_QGesture_*>_> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.bucket = 0;
  local_20.d = this;
  if (this->spans->offsets[0] == 0xff) {
    iterator<QHashPrivate::Node<QWidget_*,_QGesture_*>_>::operator++(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  iVar1.bucket = local_20.bucket;
  iVar1.d = local_20.d;
  return iVar1;
}

Assistant:

iterator begin() const noexcept
    {
        iterator it{ this, 0 };
        if (it.isUnused())
            ++it;
        return it;
    }